

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

uint32_t __thiscall
diligent_spirv_cross::Compiler::get_extended_decoration
          (Compiler *this,uint32_t id,ExtendedDecorations decoration)

{
  bool bVar1;
  Meta *pMVar2;
  Decoration *dec;
  Meta *local_28;
  Meta *m;
  ExtendedDecorations decoration_local;
  uint32_t id_local;
  Compiler *this_local;
  
  m._0_4_ = decoration;
  m._4_4_ = id;
  _decoration_local = this;
  TypedID<(diligent_spirv_cross::Types)0>::TypedID
            ((TypedID<(diligent_spirv_cross::Types)0> *)((long)&dec + 4),id);
  pMVar2 = ParsedIR::find_meta(&this->ir,dec._4_4_);
  if (pMVar2 == (Meta *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    local_28 = pMVar2;
    bVar1 = Bitset::get(&(pMVar2->decoration).extended.flags,(ExtendedDecorations)m);
    if (bVar1) {
      this_local._4_4_ = (pMVar2->decoration).extended.values[(ExtendedDecorations)m];
    }
    else {
      this_local._4_4_ = get_default_extended_decoration((ExtendedDecorations)m);
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t Compiler::get_extended_decoration(uint32_t id, ExtendedDecorations decoration) const
{
	auto *m = ir.find_meta(id);
	if (!m)
		return 0;

	auto &dec = m->decoration;

	if (!dec.extended.flags.get(decoration))
		return get_default_extended_decoration(decoration);

	return dec.extended.values[decoration];
}